

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_wrap.hpp
# Opt level: O0

Module * chaiscript::json_wrap::library(Module *m)

{
  Module *this;
  allocator<char> local_99;
  string local_98;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Boxed_Value_ptr *local_78;
  Proxy_Function local_70 [2];
  allocator<char> local_49;
  string local_48;
  anon_class_1_0_00000001_for_m_f local_21;
  Proxy_Function local_20;
  Module *local_10;
  Module *m_local;
  
  local_10 = m;
  fun<chaiscript::json_wrap::library(chaiscript::Module&)::_lambda(std::__cxx11::string_const&)_1_>
            ((chaiscript *)&local_20,&local_21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"from_json",&local_49);
  Module::add(m,&local_20,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_20);
  this = local_10;
  local_78 = to_json_abi_cxx11_;
  fun<std::__cxx11::string(*)(chaiscript::Boxed_Value_const&)>((chaiscript *)local_70,&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"to_json",&local_99);
  Module::add(this,local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_70);
  return local_10;
}

Assistant:

static Module &library(Module &m) {
      m.add(chaiscript::fun([](const std::string &t_str) { return from_json(t_str); }), "from_json");
      m.add(chaiscript::fun(&json_wrap::to_json), "to_json");

      return m;
    }